

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::AggressiveDCEPass::GetLoadedVariables
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          AggressiveDCEPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> __l;
  Op OVar1;
  allocator<unsigned_int> local_3d;
  uint32_t local_3c;
  iterator local_38;
  size_type local_30;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t var_id;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  this_local = (AggressiveDCEPass *)__return_storage_ptr__;
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 == OpFunctionCall) {
    GetLoadedVariablesFromFunctionCall(__return_storage_ptr__,this,pIStack_20);
  }
  else {
    local_3c = GetLoadedVariableFromNonFunctionCalls(this,pIStack_20);
    local_24 = local_3c;
    if (local_3c == 0) {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
    }
    else {
      local_38 = &local_3c;
      local_30 = 1;
      std::allocator<unsigned_int>::allocator(&local_3d);
      __l._M_len = local_30;
      __l._M_array = local_38;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,__l,&local_3d);
      std::allocator<unsigned_int>::~allocator(&local_3d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> AggressiveDCEPass::GetLoadedVariables(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpFunctionCall) {
    return GetLoadedVariablesFromFunctionCall(inst);
  }
  uint32_t var_id = GetLoadedVariableFromNonFunctionCalls(inst);
  if (var_id == 0) {
    return {};
  }
  return {var_id};
}